

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::EndTable(void)

{
  ImVec4 *pIVar1;
  float fVar2;
  char cVar3;
  ImGuiTable *pIVar4;
  ImGuiWindow *window;
  ImGuiWindow *pIVar5;
  ulong uVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  char *__function;
  ImGuiTableColumn *pIVar13;
  ImDrawList *draw_list;
  ImGuiTableColumn *column;
  ImGuiTable *p;
  ulong uVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentTable;
  if (pIVar4 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x48c,"void ImGui::EndTable()");
  }
  if (pIVar4->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar4);
  }
  window = pIVar4->InnerWindow;
  if (window != pIVar8->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49a,"void ImGui::EndTable()");
  }
  uVar10 = pIVar4->Flags;
  pIVar5 = pIVar4->OuterWindow;
  if ((pIVar5 != window) && (pIVar5 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x49b,"void ImGui::EndTable()");
  }
  if (pIVar4->IsInsideRow == true) {
    TableEndRow(pIVar4);
  }
  if (((uVar10 & 0x20) != 0) && (pIVar4->HoveredColumnBody != -1)) {
    bVar9 = IsAnyItemHovered();
    if (!bVar9) {
      bVar9 = IsMouseReleased(1);
      if (bVar9) {
        TableOpenContextMenu((int)pIVar4->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar4->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar4->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar4->HostBackupCursorMaxPos;
  fVar2 = pIVar4->RowPosY2;
  fVar21 = (window->DC).CursorPos.y;
  if ((fVar2 != fVar21) || (NAN(fVar2) || NAN(fVar21))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x4aa,"void ImGui::EndTable()");
  }
  auVar23 = ZEXT416((uint)fVar2);
  if (pIVar5 == window) {
    if ((uVar10 >> 0x11 & 1) == 0) {
      auVar16 = ZEXT416((uint)(pIVar4->OuterRect).Max.y);
      auVar17 = vcmpss_avx(auVar23,auVar16,2);
      auVar17 = vblendvps_avx(auVar23,auVar16,auVar17);
      (pIVar4->InnerRect).Max.y = auVar17._0_4_;
      (pIVar4->OuterRect).Max.y = auVar17._0_4_;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar2;
  }
  fVar21 = (pIVar4->OuterRect).Max.y;
  auVar16 = ZEXT416((uint)(pIVar4->WorkRect).Max.y);
  auVar17 = vcmpss_avx(ZEXT416((uint)fVar21),auVar16,2);
  auVar17 = vblendvps_avx(ZEXT416((uint)fVar21),auVar16,auVar17);
  (pIVar4->WorkRect).Max.y = auVar17._0_4_;
  pIVar4->LastOuterHeight = fVar21 - (pIVar4->OuterRect).Min.y;
  if (((uint)pIVar4->Flags >> 0x18 & 1) != 0) {
    fVar21 = (pIVar4->InnerWindow->DC).CursorMaxPos.x;
    auVar20 = ZEXT464((uint)fVar21);
    cVar3 = pIVar4->RightMostEnabledColumn;
    if ((long)cVar3 != -1) {
      if ((cVar3 < '\0') ||
         (pIVar13 = (pIVar4->Columns).Data + cVar3, (pIVar4->Columns).DataEnd <= pIVar13))
      goto LAB_00198a4e;
      fVar22 = 0.0;
      if (((uint)pIVar4->Flags >> 10 & 1) != 0) {
        fVar22 = 1.0;
      }
      auVar16 = ZEXT416((uint)((pIVar13->WorkMaxX + pIVar4->CellPaddingX + pIVar4->OuterPaddingX) -
                              fVar22));
      auVar17 = vcmpss_avx(auVar16,ZEXT416((uint)fVar21),2);
      auVar17 = vblendvps_avx(auVar16,ZEXT416((uint)fVar21),auVar17);
      auVar20 = ZEXT1664(auVar17);
    }
    if (pIVar4->ResizedColumn != -1) {
      auVar17 = vcmpss_avx(ZEXT416((uint)pIVar4->ResizeLockMinContentsX2),auVar20._0_16_,2);
      auVar17 = vblendvps_avx(ZEXT416((uint)pIVar4->ResizeLockMinContentsX2),auVar20._0_16_,auVar17)
      ;
      auVar20 = ZEXT1664(auVar17);
    }
    (pIVar4->InnerWindow->DC).CursorMaxPos.x = auVar20._0_4_;
  }
  if ((uVar10 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  lVar12 = (long)(draw_list->_ClipRectStack).Size;
  if (lVar12 < 1) {
    __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
    goto LAB_00198b15;
  }
  pIVar1 = (draw_list->_ClipRectStack).Data + lVar12 + -1;
  fVar21 = pIVar1->y;
  fVar22 = pIVar1->z;
  fVar15 = pIVar1->w;
  (window->ClipRect).Min.x = pIVar1->x;
  (window->ClipRect).Min.y = fVar21;
  (window->ClipRect).Max.x = fVar22;
  (window->ClipRect).Max.y = fVar15;
  if ((uVar10 & 0x780) != 0) {
    TableDrawBorders(pIVar4);
    draw_list = window->DrawList;
  }
  ImDrawListSplitter::SetCurrentChannel(&pIVar4->DrawSplitter,draw_list,0);
  if ((pIVar4->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar4);
  }
  ImDrawListSplitter::Merge(&pIVar4->DrawSplitter,window->DrawList);
  fVar22 = pIVar4->CellPaddingX + pIVar4->CellPaddingX;
  fVar21 = fVar22 * (float)(int)pIVar4->ColumnsEnabledCount +
           pIVar4->OuterPaddingX + pIVar4->OuterPaddingX +
           (pIVar4->CellSpacingX1 + pIVar4->CellSpacingX2) *
           (float)(pIVar4->ColumnsEnabledCount + -1);
  pIVar4->ColumnsAutoFitWidth = fVar21;
  iVar11 = pIVar4->ColumnsCount;
  if (0 < (long)iVar11) {
    uVar6 = pIVar4->EnabledMaskByIndex;
    lVar12 = 0x10;
    uVar14 = 0;
    do {
      if ((uVar6 >> (uVar14 & 0x3f) & 1) != 0) {
        pIVar13 = (pIVar4->Columns).Data;
        column = (ImGuiTableColumn *)((long)pIVar13 + lVar12 + -0x10);
        if ((pIVar4->Columns).DataEnd <= column) goto LAB_00198a4e;
        if ((column->Flags & 0x18U) == 8) {
          fVar15 = *(float *)((long)&pIVar13->Flags + lVar12);
        }
        else {
          fVar15 = TableGetColumnWidthAuto(pIVar4,column);
        }
        fVar21 = fVar15 + fVar21;
        pIVar4->ColumnsAutoFitWidth = fVar21;
      }
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x68;
    } while ((long)iVar11 != uVar14);
  }
  if ((pIVar5 == window) || ((pIVar4->Flags & 0x1000000U) != 0)) {
    cVar3 = pIVar4->LastResizedColumn;
    if (((long)cVar3 != -1) &&
       (((pIVar4->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar4->InstanceInteracted == pIVar4->InstanceCurrent)))) {
      if ((cVar3 < '\0') ||
         (pIVar13 = (pIVar4->Columns).Data + cVar3, (pIVar4->Columns).DataEnd <= pIVar13))
      goto LAB_00198a4e;
      fVar22 = fVar22 + pIVar4->MinColumnWidth;
      fVar21 = pIVar13->MaxX;
      if ((pIVar4->InnerClipRect).Min.x <= fVar21) {
        if (fVar21 <= (pIVar4->InnerClipRect).Max.x) goto LAB_001986c0;
        fVar22 = fVar22 + (fVar21 - (window->Pos).x);
      }
      else {
        fVar22 = (fVar21 - (window->Pos).x) - fVar22;
      }
      SetScrollFromPosX(window,fVar22,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001986c0:
  cVar3 = pIVar4->ResizedColumn;
  if (((long)cVar3 != -1) && (pIVar4->InstanceCurrent == pIVar4->InstanceInteracted)) {
    if ((cVar3 < '\0') ||
       (pIVar13 = (pIVar4->Columns).Data + cVar3, (pIVar4->Columns).DataEnd <= pIVar13)) {
LAB_00198a4e:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                    ,0x216,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    auVar17 = vcvtdq2ps_avx(ZEXT416((uint)(int)((((((pIVar8->IO).MousePos.x -
                                                   (pIVar8->ActiveIdClickOffset).x) + 4.0) -
                                                 pIVar13->MinX) - pIVar4->CellSpacingX1) -
                                               (pIVar4->CellPaddingX + pIVar4->CellPaddingX))));
    pIVar4->ResizedColumnNextWidth = auVar17._0_4_;
  }
  lVar12 = (long)(window->IDStack).Size;
  if (lVar12 < 1) {
    __function = "T &ImVector<unsigned int>::back() [T = unsigned int]";
LAB_00198b15:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                  ,0x674,__function);
  }
  if ((window->IDStack).Data[lVar12 + -1] != (int)pIVar4->InstanceCurrent + pIVar4->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x503,"void ImGui::EndTable()");
  }
  if ((pIVar5->DC).ItemWidthStack.Size < pIVar4->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x504,"void ImGui::EndTable()");
  }
  PopID();
  auVar17 = ZEXT416((uint)(pIVar5->DC).CursorMaxPos.x);
  auVar16 = ZEXT416((uint)(pIVar5->DC).CursorMaxPos.y);
  IVar7 = (pIVar4->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar4->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar7;
  IVar7 = (pIVar4->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar4->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar7;
  window->SkipItems = pIVar4->HostSkipItems;
  (pIVar5->DC).CursorPos = (pIVar4->OuterRect).Min;
  (pIVar5->DC).ItemWidth = pIVar4->HostBackupItemWidth;
  (pIVar5->DC).ItemWidthStack.Size = pIVar4->HostBackupItemWidthStackSize;
  (pIVar5->DC).ColumnsOffset.x = (pIVar4->HostBackupColumnsOffset).x;
  if (pIVar5 == window) {
    auVar19._8_8_ = 0;
    auVar19._0_4_ = (pIVar4->OuterRect).Min.x;
    auVar19._4_4_ = (pIVar4->OuterRect).Min.y;
    auVar18._8_8_ = 0;
    auVar18._0_4_ = (pIVar4->OuterRect).Max.x;
    auVar18._4_4_ = (pIVar4->OuterRect).Max.y;
    auVar19 = vsubps_avx(auVar18,auVar19);
    local_38 = (ImVec2)vmovlps_avx(auVar19);
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar4->OuterRect,0,(ImRect *)0x0);
  }
  else {
    EndChild();
  }
  uVar10 = pIVar4->Flags;
  if ((uVar10 >> 0x10 & 1) == 0) {
    fVar21 = (pIVar4->UserOuterSize).x;
    fVar22 = 0.0;
    if (fVar21 <= 0.0) {
      if ((uVar10 >> 0x18 & 1) != 0) {
        fVar22 = (window->ScrollbarSizes).x;
      }
      fVar15 = (pIVar4->OuterRect).Min.x + pIVar4->ColumnsAutoFitWidth;
      auVar18 = ZEXT416((uint)((fVar22 + fVar15) - fVar21));
      auVar24 = ZEXT416((uint)(pIVar5->DC).IdealMaxPos.x);
      auVar19 = vcmpss_avx(auVar18,auVar24,2);
      auVar19 = vblendvps_avx(auVar18,auVar24,auVar19);
      (pIVar5->DC).IdealMaxPos.x = auVar19._0_4_;
      auVar19 = vminss_avx(ZEXT416((uint)(pIVar4->OuterRect).Max.x),ZEXT416((uint)fVar15));
    }
    else {
      auVar19 = ZEXT416((uint)(pIVar4->OuterRect).Max.x);
    }
  }
  else {
    if ((uVar10 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                    ,0x523,"void ImGui::EndTable()");
    }
    auVar19 = ZEXT416((uint)((pIVar4->OuterRect).Min.x + pIVar4->ColumnsAutoFitWidth));
  }
  auVar18 = vcmpss_avx(auVar19,auVar17,2);
  auVar17 = vblendvps_avx(auVar19,auVar17,auVar18);
  (pIVar5->DC).CursorMaxPos.x = auVar17._0_4_;
  fVar21 = (pIVar4->UserOuterSize).y;
  fVar22 = 0.0;
  if (fVar21 <= 0.0) {
    if ((uVar10 >> 0x19 & 1) != 0) {
      fVar22 = (window->ScrollbarSizes).y;
    }
    auVar19 = ZEXT416((uint)((fVar2 + fVar22) - fVar21));
    auVar18 = ZEXT416((uint)(pIVar5->DC).IdealMaxPos.y);
    auVar17 = vcmpss_avx(auVar19,auVar18,2);
    auVar17 = vblendvps_avx(auVar19,auVar18,auVar17);
    (pIVar5->DC).IdealMaxPos.y = auVar17._0_4_;
    auVar23 = vminss_avx(ZEXT416((uint)(pIVar4->OuterRect).Max.y),auVar23);
  }
  else {
    auVar23 = ZEXT416((uint)(pIVar4->OuterRect).Max.y);
  }
  auVar17 = vcmpss_avx(auVar23,auVar16,2);
  auVar23 = vblendvps_avx(auVar23,auVar16,auVar17);
  (pIVar5->DC).CursorMaxPos.y = auVar23._0_4_;
  if (pIVar4->IsSettingsDirty == true) {
    TableSaveSettings(pIVar4);
  }
  pIVar4->IsInitializing = false;
  if ((pIVar8->CurrentWindow != pIVar5) || (pIVar8->CurrentTable != pIVar4)) {
    __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x542,"void ImGui::EndTable()");
  }
  iVar11 = (pIVar8->CurrentTableStack).Size;
  if (iVar11 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                  ,0x680,"void ImVector<ImGuiPtrOrIndex>::pop_back() [T = ImGuiPtrOrIndex]");
  }
  uVar10 = iVar11 - 1;
  (pIVar8->CurrentTableStack).Size = uVar10;
  if (uVar10 == 0) {
    pIVar8->CurrentTable = (ImGuiTable *)0x0;
  }
  else {
    iVar11 = (pIVar8->CurrentTableStack).Data[(ulong)uVar10 - 1].Index;
    if (((long)iVar11 < 0) || ((pIVar8->Tables).Buf.Size <= iVar11)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                    ,0x66a,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
    }
    pIVar4 = (pIVar8->Tables).Buf.Data;
    p = pIVar4 + iVar11;
    pIVar8->CurrentTable = p;
    if (pIVar4 != (ImGuiTable *)0x0) {
      iVar11 = ImPool<ImGuiTable>::GetIndex(&pIVar8->Tables,p);
      goto LAB_00198a38;
    }
  }
  iVar11 = -1;
LAB_00198a38:
  (pIVar5->DC).CurrentTableIdx = iVar11;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}